

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int duckdb_fmt::v6::internal::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  size_t sVar1;
  bool bVar2;
  buffer<char> *pbVar3;
  int iVar4;
  result rVar5;
  result rVar6;
  long lVar7;
  ulong uVar8;
  char cVar9;
  ulong uVar12;
  uint64_t uVar13;
  size_t __len;
  ulong remainder;
  int exp;
  fixed_handler handler;
  int local_64;
  buffer<char> *local_60;
  longdouble local_54;
  fixed_handler local_48;
  char cVar10;
  char cVar11;
  
  uVar12 = (ulong)(uint)precision;
  uVar8 = (ulong)specs & 0xff00000000;
  local_54 = value;
  if (value <= (longdouble)0) {
    if (precision < 1 || uVar8 != 0x200000000) {
      if (buf->capacity_ < buf->size_ + 1) {
        (**buf->_vptr_buffer)(buf);
      }
      sVar1 = buf->size_;
      buf->size_ = sVar1 + 1;
      buf->ptr_[sVar1] = '0';
      precision = 0;
    }
    else {
      if (buf->capacity_ < uVar12) {
        (**buf->_vptr_buffer)(buf,uVar12);
      }
      buf->size_ = uVar12;
      switchD_0130b471::default(buf->ptr_,0x30,uVar12);
      precision = -precision;
    }
  }
  else if (((ulong)specs >> 0x3c & 1) == 0) {
    precision = snprintf_float<long_double>(value,precision,specs,buf);
  }
  else {
    local_64 = 0;
    local_60 = buf;
    if (precision == -1) {
      remainder = 0x26604b7a84467;
      local_48.buf = buf->ptr_;
      local_48.size = 0;
      local_48.exp10 = -0x4857bb99;
      local_48.fixed = true;
      local_48._21_3_ = 0x465e66;
      local_64 = 4;
      uVar12 = 0x1197;
      precision = 0x1e5bc24;
      do {
        lVar7 = (long)local_64;
        cVar10 = '\0';
        cVar9 = '\0';
        cVar11 = '\0';
        switch(local_64) {
        case 1:
          cVar9 = (char)uVar12;
          uVar12 = 0;
          goto switchD_01821ac2_default;
        case 2:
          cVar9 = (char)(uVar12 / 10);
          iVar4 = (int)(uVar12 / 10) * 10;
          break;
        case 3:
          cVar9 = (char)(uVar12 / 100);
          iVar4 = (int)(uVar12 / 100) * 100;
          break;
        case 4:
          cVar9 = (char)(uVar12 / 1000);
          iVar4 = (int)(uVar12 / 1000) * 1000;
          break;
        case 5:
          iVar4 = (int)(uVar12 / 10000) * 10000;
          cVar9 = cVar11;
          break;
        case 6:
          iVar4 = (int)(uVar12 / 100000) * 100000;
          cVar9 = cVar11;
          break;
        case 7:
          iVar4 = (int)(uVar12 / 1000000) * 1000000;
          cVar9 = cVar11;
          break;
        case 8:
          iVar4 = (int)(uVar12 / 10000000) * 10000000;
          cVar9 = cVar10;
          break;
        case 9:
          iVar4 = (int)(uVar12 / 100000000) * 100000000;
          cVar9 = cVar10;
          break;
        case 10:
          iVar4 = (uint)((uVar12 >> 9) * 0x44b83 >> 0x27) * 1000000000;
          cVar9 = cVar10;
          break;
        default:
          goto switchD_01821ac2_default;
        }
        uVar12 = (ulong)(uint)((int)uVar12 - iVar4);
switchD_01821ac2_default:
        local_64 = local_64 + -1;
        rVar5 = grisu_shortest_handler::on_digit
                          ((grisu_shortest_handler *)&local_48,cVar9 + '0',
                           *(long *)("error " + lVar7 * 8 + 4) << 0x32,
                           uVar12 << 0x32 | 0x26604b7a84467,2,local_64,true);
        uVar8 = uVar8 & 0xffffffff;
        if (rVar5 != more) {
          uVar8 = (ulong)rVar5;
        }
        rVar6 = (result)uVar8;
        if (rVar5 != more) goto LAB_01821c54;
      } while (0 < local_64);
      uVar13 = 2;
      precision = -2;
      do {
        uVar12 = remainder * 10;
        uVar13 = uVar13 * 10;
        remainder = uVar12 & 0x3fffffffffffe;
        local_64 = local_64 + -1;
        rVar5 = grisu_shortest_handler::on_digit
                          ((grisu_shortest_handler *)&local_48,(byte)(uVar12 >> 0x32) | 0x30,
                           0x4000000000000,remainder,uVar13,local_64,false);
        if (rVar5 != more) {
          uVar8 = (ulong)rVar5;
        }
        rVar6 = (result)uVar8;
      } while (rVar5 == more);
LAB_01821c54:
      pbVar3 = local_60;
      uVar12 = (ulong)(uint)local_48.size;
      if (rVar6 == error) {
        local_64 = local_64 + local_48.size + 0xb;
        fallback_format<long_double>(local_54,local_60,&local_64);
        precision = local_64;
      }
      else {
        if (local_60->capacity_ < uVar12) {
          (**local_60->_vptr_buffer)(local_60,uVar12);
        }
        pbVar3->size_ = uVar12;
      }
    }
    else {
      if (0x11 < precision) {
        iVar4 = snprintf_float<long_double>(value,precision,specs,buf);
        return iVar4;
      }
      local_48.buf = buf->ptr_;
      local_48.size = 0;
      local_48.fixed = uVar8 == 0x200000000;
      local_48.exp10 = 0xc;
      local_64 = 1;
      local_48.precision = precision;
      rVar6 = fixed_handler::on_start(&local_48,0x4000000000000,0,10,&local_64);
      if (rVar6 == more) {
        do {
          lVar7 = (long)local_64;
          local_64 = local_64 + -1;
          rVar6 = fixed_handler::on_digit
                            (&local_48,'0',*(long *)("error " + lVar7 * 8 + 4) << 0x32,0,1,local_64,
                             true);
          if (rVar6 != more) goto LAB_01821d77;
        } while (0 < local_64);
        uVar13 = 1;
        do {
          uVar13 = uVar13 * 10;
          local_64 = local_64 + -1;
          rVar6 = fixed_handler::on_digit(&local_48,'0',0x4000000000000,0,uVar13,local_64,false);
        } while (rVar6 == more);
      }
LAB_01821d77:
      pbVar3 = local_60;
      if (rVar6 == error) {
        precision = snprintf_float<long_double>(local_54,precision,specs,local_60);
      }
      else {
        uVar12 = (ulong)(uint)local_48.size;
        if (0 < local_48.size && uVar8 != 0x200000000) {
          uVar12 = (ulong)(uint)local_48.size;
          do {
            iVar4 = local_64 + 1;
            if (local_60->ptr_[uVar12 - 1] != '0') goto LAB_01821e11;
            bVar2 = 1 < (long)uVar12;
            uVar12 = uVar12 - 1;
            local_64 = iVar4;
          } while (bVar2);
          uVar12 = 0;
        }
LAB_01821e11:
        uVar12 = uVar12 & 0xffffffff;
        if (local_60->capacity_ < uVar12) {
          (**local_60->_vptr_buffer)(local_60,uVar12);
        }
        pbVar3->size_ = uVar12;
      }
    }
    if (rVar6 != error) {
      precision = local_64 + 0xc;
    }
  }
  return precision;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>(), "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision != -1) {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  } else {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  }
  return exp - cached_exp10;
}